

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

char * getstring_aux(lua_State *L,char *buff,char **pc)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  byte bVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  
  skip(pc);
  pbVar6 = (byte *)*pc;
  bVar1 = *pbVar6;
  uVar7 = (ulong)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
      pbVar2 = pbVar6 + 1;
      uVar7 = 0;
      *pc = (char *)pbVar2;
      bVar1 = *pbVar6;
      bVar4 = pbVar6[1];
      if (bVar4 != bVar1) {
        uVar7 = 0;
        do {
          if (bVar4 == 0) {
            luaL_error(L,"unfinished string in C script");
            pbVar2 = (byte *)*pc;
          }
          *pc = (char *)(pbVar2 + 1);
          buff[uVar7] = *pbVar2;
          uVar7 = uVar7 + 1;
          pbVar2 = (byte *)*pc;
          bVar4 = *pbVar2;
        } while (bVar4 != bVar1);
      }
      *pc = (char *)(pbVar2 + 1);
    }
    else {
      uVar5 = 0;
      do {
        pvVar3 = memchr(" \t\n,;",(int)(char)uVar7,6);
        if (pvVar3 != (void *)0x0) break;
        *pc = (char *)(pbVar6 + 1);
        buff[uVar5] = *pbVar6;
        uVar5 = uVar5 + 1;
        pbVar6 = (byte *)*pc;
        uVar7 = (ulong)*pbVar6;
      } while (*pbVar6 != 0);
      uVar7 = uVar5 & 0xffffffff;
    }
  }
  buff[uVar7 & 0xffffffff] = '\0';
  return buff;
}

Assistant:

static const char *getstring_aux (lua_State *L, char *buff, const char **pc) {
  int i = 0;
  skip(pc);
  if (**pc == '"' || **pc == '\'') {  /* quoted string? */
    int quote = *(*pc)++;
    while (**pc != quote) {
      if (**pc == '\0') luaL_error(L, "unfinished string in C script");
      buff[i++] = *(*pc)++;
    }
    (*pc)++;
  }
  else {
    while (**pc != '\0' && !strchr(delimits, **pc))
      buff[i++] = *(*pc)++;
  }
  buff[i] = '\0';
  return buff;
}